

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void fl_init_xim(void)

{
  short *local_10;
  XIMStyles *xim_styles;
  
  if (0 < fl_init_xim::xim_warning) {
    fl_init_xim::xim_warning = fl_init_xim::xim_warning + -1;
  }
  if ((fl_display != (Display *)0x0) && (fl_xim_im == (XIM)0x0)) {
    fl_xim_im = (XIM)XOpenIM(fl_display,0,0);
    local_10 = (short *)0x0;
    fl_xim_ic = (XIC)0x0;
    if (fl_xim_im == (XIM)0x0) {
      if (fl_init_xim::xim_warning != 0) {
        (*Fl::warning)("XOpenIM() failed");
      }
      if (local_10 != (short *)0x0) {
        XFree(local_10);
      }
    }
    else {
      XGetIMValues(fl_xim_im,"queryInputStyle",&local_10,0);
      if ((local_10 == (short *)0x0) || (*local_10 == 0)) {
        if (fl_init_xim::xim_warning != 0) {
          (*Fl::warning)("No XIM style found");
        }
        XCloseIM(fl_xim_im);
        fl_xim_im = (XIM)0x0;
        if (local_10 != (short *)0x0) {
          XFree(local_10);
        }
      }
      else {
        fl_new_ic();
        if (fl_xim_ic == (XIC)0x0) {
          if (fl_init_xim::xim_warning != 0) {
            (*Fl::warning)("XCreateIC() failed");
          }
          XCloseIM(fl_xim_im);
          fl_xim_im = (XIM)0x0;
        }
        if (local_10 != (short *)0x0) {
          XFree(local_10);
        }
      }
    }
  }
  return;
}

Assistant:

static void fl_init_xim() {
  static int xim_warning = 2;
  if (xim_warning > 0) xim_warning--;

  //XIMStyle *style;
  XIMStyles *xim_styles;
  if (!fl_display) return;
  if (fl_xim_im) return;

  fl_xim_im = XOpenIM(fl_display, NULL, NULL, NULL);
  xim_styles = NULL;
  fl_xim_ic = NULL;

  if (fl_xim_im) {
    XGetIMValues (fl_xim_im, XNQueryInputStyle,
                  &xim_styles, NULL, NULL);
  } else {
    if (xim_warning)
      Fl::warning("XOpenIM() failed");
    // if xim_styles is allocated, free it now
    if (xim_styles) XFree(xim_styles);
    return;
  }

  if (xim_styles && xim_styles->count_styles) {
    fl_new_ic();
   } else {
     if (xim_warning)
       Fl::warning("No XIM style found");
     XCloseIM(fl_xim_im);
     fl_xim_im = NULL;
     // if xim_styles is allocated, free it now
     if (xim_styles) XFree(xim_styles);
     return;
  }
  if (!fl_xim_ic) {
    if (xim_warning)
      Fl::warning("XCreateIC() failed");
    XCloseIM(fl_xim_im);
    fl_xim_im = NULL;
  }
  // if xim_styles is still allocated, free it now
  if(xim_styles) XFree(xim_styles);
}